

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

bool __thiscall Clasp::mt::ParallelHandler::isModel(ParallelHandler *this,Solver *s)

{
  size_type sVar1;
  bool bVar2;
  
  bVar2 = ParallelSolve::integrateModels(this->ctrl_,s,&(this->gp_).modCount);
  if ((bVar2) &&
     (sVar1 = (s->assign_).trail.ebo_.size,
     (s->assign_).assign_.ebo_.size == (s->assign_).elims_ + sVar1 + 1)) {
    bVar2 = sVar1 == (s->assign_).front;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ParallelHandler::isModel(Solver& s) {
	assert(s.numFreeVars() == 0);
	// either no unprocessed updates or still a model after
	// updates were integrated
	return ctrl_->integrateModels(s, gp_.modCount)
		&& s.numFreeVars() == 0
		&& s.queueSize()   == 0;
}